

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O3

BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
* b_array::delete_item<BPlusTree<Map::Pair<std::__cxx11::string,Table>>*>
            (Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
             *data,int index,size_t *size)

{
  ulong index_00;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
  *pBVar1;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
  *pBVar2;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
  **ppBVar3;
  size_t sVar4;
  size_t index_01;
  
  if (*size != 0) {
    index_01 = (size_t)index;
    ppBVar3 = Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
              ::operator[](data,index_01);
    pBVar1 = *ppBVar3;
    sVar4 = *size;
    if (index_01 < sVar4 - 1) {
      do {
        index_00 = index_01 + 1;
        ppBVar3 = Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
                  ::operator[](data,index_00);
        pBVar2 = *ppBVar3;
        ppBVar3 = Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
                  ::operator[](data,index_01);
        *ppBVar3 = pBVar2;
        sVar4 = *size;
        index_01 = index_00;
      } while (index_00 < sVar4 - 1);
    }
    ppBVar3 = Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
              ::operator[](data,sVar4);
    *ppBVar3 = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
                *)0x0;
    sVar4 = *size;
    *size = sVar4 - 1;
    ppBVar3 = Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>_*>
              ::operator[](data,sVar4 - 1);
    *ppBVar3 = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
                *)0x0;
    return pBVar1;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jaasonw[P]Database/include/util/array/array_util.h"
                ,0x56,
                "T b_array::delete_item(b_array::Array<T> &, int, size_t &) [T = BPlusTree<Map::Pair<std::basic_string<char>, Table>> *]"
               );
}

Assistant:

T delete_item(b_array::Array<T>& data, int index, size_t& size) {
    assert(size > 0);
    T item = data[index];
    for (size_t i = index; i < size - 1; i++) {
        data[i] = data[i + 1];
    }
    data[size] = T();
    data[--size] = T();
    return item;
}